

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  IfcRelContainedInSpatialStructure *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xd8,"IfcRelContainedInSpatialStructure");
  IfcRelConnects::IfcRelConnects(&this->super_IfcRelConnects,&PTR_construction_vtable_24__01068288);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,
             &PTR_construction_vtable_24__01068300);
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x10681d0;
  *(undefined8 *)&this->field_0xd8 = 0x1068270;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       0x10681f8;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       0x1068220;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = 0x1068248;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL> *)
             &(this->super_IfcRelConnects).field_0xb8);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::Lazy
            (&this->RelatingStructure,(LazyObject *)0x0);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}